

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

int RankIsPlausible(pyhanabi_card_knowledge_t *knowledge,int rank)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  
  if (knowledge == (pyhanabi_card_knowledge_t *)0x0) {
    __assertion = "knowledge != nullptr";
    __line = 100;
  }
  else {
    if (knowledge->knowledge != (void *)0x0) {
      bVar1 = hanabi_learning_env::HanabiHand::ValueKnowledge::IsPlausible
                        ((ValueKnowledge *)((long)knowledge->knowledge + 0x30),rank);
      return (int)bVar1;
    }
    __assertion = "knowledge->knowledge != nullptr";
    __line = 0x65;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,__line,"int RankIsPlausible(pyhanabi_card_knowledge_t *, int)");
}

Assistant:

int RankIsPlausible(pyhanabi_card_knowledge_t* knowledge, int rank) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->RankPlausible(rank);
}